

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O3

bool __thiscall SAT::propagate(SAT *this)

{
  anon_union_8_2_743a5d44_for_Reason_0 *paVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  char *pcVar5;
  Clause *pCVar6;
  char cVar7;
  uint uVar8;
  anon_union_8_2_743a5d44_for_Reason_0 *paVar9;
  uint uVar10;
  uint uVar11;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  ulong uVar12;
  Lit p;
  ulong uVar13;
  vec<Lit> *pvVar14;
  char cVar15;
  vec<WatchElem> *pvVar16;
  uint uVar17;
  anon_union_8_2_743a5d44_for_Reason_0 *paVar18;
  anon_union_8_2_743a5d44_for_Reason_0 *paVar19;
  anon_union_8_2_743a5d44_for_Reason_0 *paVar20;
  anon_union_8_2_743a5d44_for_Reason_0 local_38;
  
  piVar4 = (this->qhead).data;
  uVar11 = (this->qhead).sz - 1;
  pvVar14 = (this->trail).data;
  uVar8 = (this->trail).sz - 1;
  uVar10 = piVar4[uVar11];
  uVar12 = 0;
  if ((int)uVar10 < (int)pvVar14[uVar8].sz) {
    pvVar14 = pvVar14 + uVar8;
    do {
      piVar4[uVar11] = uVar10 + 1;
      uVar8 = pvVar14->data[uVar10].x;
      pvVar16 = (this->watches).data;
      uVar13 = (ulong)pvVar16[uVar8].sz;
      uVar10 = uVar10 + 1;
      if (uVar13 != 0) {
        pvVar16 = pvVar16 + uVar8;
        paVar9 = (anon_union_8_2_743a5d44_for_Reason_0 *)pvVar16->data;
        paVar1 = paVar9 + uVar13;
        paVar19 = paVar9;
        do {
          r._a = (uint64_t)paVar9->_pt;
          uVar10 = (uint)r._a & 3;
          paVar18 = paVar9 + 1;
          if (uVar10 == 2) {
            paVar19->_pt = (Clause *)r;
            paVar20 = paVar19 + 1;
            (*engine.propagators.data[paVar9->_a >> 0x20]->_vptr_Propagator[2])
                      (engine.propagators.data[paVar9->_a >> 0x20],paVar9->_a >> 2 & 0x3fffffff,0);
            paVar9 = paVar18;
          }
          else {
            uVar17 = (uint)((long)(int)uVar8 ^ 1U);
            if (uVar10 == 1) {
              paVar19->_pt = (Clause *)r;
              paVar20 = paVar19 + 1;
              uVar13 = paVar9->_a;
              p.x = (int)(uVar13 >> 0x20);
              cVar15 = (this->assigns).data[(long)uVar13 >> 0x21 & 0xffffffff];
              cVar7 = -cVar15;
              if ((uVar13 >> 0x20 & 1) == 0) {
                cVar7 = cVar15;
              }
              if (cVar7 == -1) {
                pCVar6 = this->short_confl;
                uVar10 = *(uint *)pCVar6;
                if ((uVar10 < 0x100) || (pCVar6->data[0].x = p.x, uVar10 < 0x200))
                goto LAB_001bfdf3;
                *(uint *)(pCVar6 + 1) = uVar17;
                this->confl = pCVar6;
                piVar4[uVar11] = pvVar14->sz;
                for (; paVar9 = paVar18, paVar18 < paVar1; paVar18 = paVar18 + 1) {
                  paVar20->_pt = (Clause *)*(Clause **)paVar18;
                  paVar20 = paVar20 + 1;
                }
              }
              else {
                r._pt = (Clause *)(((long)(int)uVar8 ^ 1U) * 4 + 2);
                paVar9 = paVar18;
                if (cVar7 == '\0') {
LAB_001bfd67:
                  enqueue(this,p,(Reason)r);
                  paVar9 = paVar18;
                  paVar20 = paVar19 + 1;
                }
              }
            }
            else {
              uVar10 = *(uint *)r._pt;
              if (uVar10 < 0x100) {
LAB_001bfdf3:
                abort();
              }
              uVar2 = (r._pt)->data[0].x;
              pcVar5 = (this->assigns).data;
              cVar15 = -pcVar5[(uint)((int)uVar2 >> 1)];
              if ((uVar2 & 1) == 0) {
                cVar15 = pcVar5[(uint)((int)uVar2 >> 1)];
              }
              if (cVar15 != ::l_True.value) {
                if (uVar10 < 0x200) goto LAB_001bfdf3;
                uVar3 = *(uint *)(r._a + 8);
                cVar15 = -pcVar5[(uint)((int)uVar3 >> 1)];
                if ((uVar3 & 1) == 0) {
                  cVar15 = pcVar5[(uint)((int)uVar3 >> 1)];
                }
                if (cVar15 != ::l_True.value) {
                  if (uVar2 == uVar17) {
                    (r._pt)->data[0].x = uVar3;
                    *(uint *)(r._a + 8) = uVar17;
                  }
                  if (0x2ff < uVar10) {
                    uVar13 = 2;
                    do {
                      uVar2 = (r._pt)->data[uVar13].x;
                      cVar15 = -pcVar5[(uint)((int)uVar2 >> 1)];
                      if ((uVar2 & 1) == 0) {
                        cVar15 = pcVar5[(uint)((int)uVar2 >> 1)];
                      }
                      if (cVar15 != ::l_False.value) {
                        *(uint *)(r._a + 8) = uVar2;
                        (r._pt)->data[uVar13].x = uVar17;
                        local_38._a = r._a;
                        vec<WatchElem>::push
                                  ((this->watches).data + ((ulong)*(uint *)(r._a + 8) ^ 1),
                                   (WatchElem *)&local_38);
                        paVar9 = paVar18;
                        paVar20 = paVar19;
                        goto LAB_001bfd6c;
                      }
                      uVar13 = uVar13 + 1;
                    } while (uVar10 >> 8 != uVar13);
                  }
                  paVar19->_pt = (Clause *)r;
                  if (*(uint *)r._pt < 0x100) goto LAB_001bfdf3;
                  p.x = (r._pt)->data[0].x;
                  cVar15 = (this->assigns).data[(uint)(p.x >> 1)];
                  cVar7 = -cVar15;
                  if ((p.x & 1U) == 0) {
                    cVar7 = cVar15;
                  }
                  if (cVar7 != ::l_False.value) goto LAB_001bfd67;
                  this->confl = (Clause *)r;
                  piVar4[uVar11] = pvVar14->sz;
                  for (; paVar19 = paVar19 + 1, paVar9 = paVar18, paVar20 = paVar19,
                      paVar18 < paVar1; paVar18 = paVar18 + 1) {
                    paVar19->_pt = (Clause *)*(Clause **)paVar18;
                  }
                  goto LAB_001bfd6c;
                }
              }
              paVar19->_pt = (Clause *)r;
              paVar9 = paVar18;
              paVar20 = paVar19 + 1;
            }
          }
LAB_001bfd6c:
          paVar19 = paVar20;
        } while (paVar9 != paVar1);
        pvVar16->sz = pvVar16->sz - (int)((ulong)((long)paVar1 - (long)paVar20) >> 3);
        uVar10 = piVar4[uVar11];
      }
      uVar8 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar8;
    } while ((int)uVar10 < (int)pvVar14->sz);
    uVar12 = (ulong)uVar8;
  }
  this->propagations = this->propagations + uVar12;
  return this->confl == (Clause *)0x0;
}

Assistant:

bool SAT::propagate() {
	int num_props = 0;

	int& qhead = this->qhead.last();
	vec<Lit>& trail = this->trail.last();

	while (qhead < static_cast<int>(trail.size())) {
		num_props++;

		const Lit p = trail[qhead++];  // 'p' is enqueued fact to propagate.
		vec<WatchElem>& ws = watches[toInt(p)];

		if (ws.size() == 0) {
			continue;
		}

		WatchElem* i;
		WatchElem* j;
		WatchElem* end;

		for (i = j = ws, end = i + ws.size(); i != end;) {
			const WatchElem& we = *i;
			switch (we.type()) {
				case 1: {
					// absorbed binary clause
					*j++ = *i++;
					const Lit q = toLit(we.d2());
					switch (toInt(value(q))) {
						case 0:
							enqueue(q, ~p);
							break;
						case -1:
							setConfl(q, ~p);
							qhead = trail.size();
							while (i < end) {
								*j++ = *i++;
							}
							break;
						default:;
					}
					continue;
				}
				case 2: {
					// wake up FD propagator
					*j++ = *i++;
					engine.propagators[we.d2()]->wakeup(we.d1(), 0);
					continue;
				}
				default:
					Clause& c = *we.pt();
					i++;

					// Check if already satisfied
					if (value(c[0]) == l_True || value(c[1]) == l_True) {
						*j++ = &c;
						continue;
					}

					const Lit false_lit = ~p;

					// Make sure the false literal is data[1]:
					if (c[0] == false_lit) {
						c[0] = c[1], c[1] = false_lit;
					}

					// Look for new watch:
					for (unsigned int k = 2; k < c.size(); k++) {
						if (value(c[k]) != l_False) {
							c[1] = c[k];
							c[k] = false_lit;
							watches[toInt(~c[1])].push(&c);
							goto FoundWatch;
						}
					}

					// Did not find watch -- clause is unit under assignment:
					*j++ = &c;
					if (value(c[0]) == l_False) {
						confl = &c;
						qhead = trail.size();
						while (i < end) {
							*j++ = *i++;
						}
					} else {
						enqueue(c[0], &c);
					}
				FoundWatch:;
			}
		}
		ws.shrink(static_cast<int>(i - j));
	}
	propagations += num_props;

	return (confl == nullptr);
}